

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall
Chainstate::InvalidBlockFound(Chainstate *this,CBlockIndex *pindex,BlockValidationState *state)

{
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<CBlockIndex_*>,_std::_Rb_tree_iterator<CBlockIndex_*>_> pVar1;
  CBlockIndex *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = pindex;
  if ((state->super_ValidationState<BlockValidationResult>).m_result != BLOCK_MUTATED) {
    *(byte *)&pindex->nStatus = (byte)pindex->nStatus | 0x20;
    std::
    _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
    ::_M_insert_unique<CBlockIndex*const&>
              ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                *)&this->m_chainman->m_failed_blocks,&local_28);
    std::
    _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
    ::_M_insert_unique<CBlockIndex*const&>
              ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                *)&this->m_blockman->m_dirty_blockindex,&local_28);
    pVar1 = std::
            _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
            ::equal_range(&(this->setBlockIndexCandidates)._M_t,&local_28);
    std::
    _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
    ::_M_erase_aux(&(this->setBlockIndexCandidates)._M_t,(_Base_ptr)pVar1.first._M_node,
                   (_Base_ptr)pVar1.second._M_node);
    InvalidChainFound(this,local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Chainstate::InvalidBlockFound(CBlockIndex* pindex, const BlockValidationState& state)
{
    AssertLockHeld(cs_main);
    if (state.GetResult() != BlockValidationResult::BLOCK_MUTATED) {
        pindex->nStatus |= BLOCK_FAILED_VALID;
        m_chainman.m_failed_blocks.insert(pindex);
        m_blockman.m_dirty_blockindex.insert(pindex);
        setBlockIndexCandidates.erase(pindex);
        InvalidChainFound(pindex);
    }
}